

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.cc
# Opt level: O2

void benchmark::BenchmarkReporter::ComputeStats
               (vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                *reports,Run *mean_data,Run *stddev_data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 auVar1 [16];
  pointer pRVar2;
  double dVar3;
  int line;
  Run *pRVar4;
  __type _Var5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  pointer pRVar9;
  char *check;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  CheckHandler local_150;
  double local_148;
  double dStack_140;
  long local_138;
  long lStack_130;
  long local_128;
  long lStack_120;
  double local_118;
  double dStack_110;
  Run *local_100;
  Stat1<double,_long> local_f8;
  Stat1<double,_long> local_d8;
  Stat1<double,_long> local_b8;
  Stat1<double,_long> local_98;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar7 = ((long)(reports->
                 super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(reports->
                super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x70;
  if (uVar7 < 2) {
    internal::CheckHandler::CheckHandler
              (&local_150,"reports.size() >= 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/reporter.cc"
               ,"ComputeStats",0x1c);
  }
  else {
    local_150.log_ = internal::GetNullLogInstance();
  }
  std::operator<<(local_150.log_,"Cannot compute stats for less than 2 reports");
  local_100 = stddev_data;
  if (uVar7 < 2) {
    internal::CheckHandler::~CheckHandler(&local_150);
  }
  local_98.numsamples_ = 0;
  local_98.sum_ = 0.0;
  local_98.sum_squares_ = 0.0;
  local_b8.numsamples_ = 0;
  local_b8.sum_ = 0.0;
  local_b8.sum_squares_ = 0.0;
  local_d8.numsamples_ = 0;
  local_d8.sum_ = 0.0;
  local_d8.sum_squares_ = 0.0;
  local_f8.numsamples_ = 0;
  local_f8.sum_ = 0.0;
  local_f8.sum_squares_ = 0.0;
  pRVar9 = (reports->
           super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (reports->
           super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = pRVar9->iterations;
  for (; local_148 = local_98.sum_, dStack_140 = local_b8.sum_, local_138 = local_98.numsamples_,
      lStack_130 = local_b8.numsamples_, local_128 = local_d8.numsamples_,
      lStack_120 = local_f8.numsamples_, local_118 = local_d8.sum_, dStack_110 = local_f8.sum_,
      pRVar9 != pRVar2; pRVar9 = pRVar9 + 1) {
    local_78 = local_98.sum_squares_;
    dStack_70 = local_b8.sum_squares_;
    local_68 = local_d8.sum_squares_;
    dStack_60 = local_f8.sum_squares_;
    _Var5 = std::operator==(&((reports->
                              super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                              )._M_impl.super__Vector_impl_data._M_start)->benchmark_name,
                            &pRVar9->benchmark_name);
    if (!_Var5) {
      check = "(reports[0].benchmark_name) == (run.benchmark_name)";
      line = 0x28;
LAB_0010d8a7:
      internal::CheckHandler::CheckHandler
                ((CheckHandler *)&local_50,check,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/reporter.cc"
                 ,"ComputeStats",line);
      internal::CheckHandler::~CheckHandler((CheckHandler *)&local_50);
    }
    internal::GetNullLogInstance();
    if (lVar8 != pRVar9->iterations) {
      check = "(run_iterations) == (run.iterations)";
      line = 0x29;
      goto LAB_0010d8a7;
    }
    internal::GetNullLogInstance();
    local_d8.numsamples_ = pRVar9->iterations;
    auVar15._0_8_ = (double)local_d8.numsamples_;
    auVar1._0_8_ = pRVar9->real_accumulated_time;
    auVar1._8_8_ = pRVar9->cpu_accumulated_time;
    auVar15._8_8_ = auVar15._0_8_;
    auVar12 = divpd(auVar1,auVar15);
    dVar10 = auVar12._0_8_;
    dVar14 = auVar12._8_8_;
    local_98.sum_ = local_148 + dVar10 * auVar15._0_8_;
    local_b8.sum_ = dStack_140 + dVar14 * auVar15._0_8_;
    auVar19._8_4_ = (int)local_d8.numsamples_;
    auVar19._0_8_ = local_d8.numsamples_;
    auVar19._12_4_ = (int)((ulong)local_d8.numsamples_ >> 0x20);
    local_98.numsamples_ = local_138 + local_d8.numsamples_;
    local_b8.numsamples_ = lStack_130 + auVar19._8_8_;
    dVar11 = pRVar9->bytes_per_second;
    dVar3 = pRVar9->items_per_second;
    local_d8.sum_ = local_118 + dVar11 * auVar15._0_8_;
    local_f8.sum_ = dStack_110 + dVar3 * auVar15._0_8_;
    local_d8.sum_squares_ = local_68 + dVar11 * dVar11 * auVar15._0_8_;
    local_f8.sum_squares_ = dStack_60 + dVar3 * dVar3 * auVar15._0_8_;
    local_d8.numsamples_ = local_128 + local_d8.numsamples_;
    local_f8.numsamples_ = lStack_120 + auVar19._8_8_;
    local_98.sum_squares_ = local_78 + dVar10 * dVar10 * auVar15._0_8_;
    local_b8.sum_squares_ = dStack_70 + dVar14 * dVar14 * auVar15._0_8_;
  }
  std::operator+(&local_50,
                 &((reports->
                   super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                   )._M_impl.super__Vector_impl_data._M_start)->benchmark_name,"_mean");
  std::__cxx11::string::operator=((string *)mean_data,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  mean_data->iterations = lVar8;
  auVar13 = _DAT_0011bd90;
  auVar16._0_8_ = (double)local_138;
  auVar16._8_8_ = (double)lStack_130;
  auVar20 = divpd(_DAT_0011bd90,auVar16);
  auVar21._0_4_ = -(uint)((int)local_138 == 0);
  auVar21._4_4_ = -(uint)((int)((ulong)local_138 >> 0x20) == 0);
  auVar21._8_4_ = -(uint)((int)lStack_130 == 0);
  auVar21._12_4_ = -(uint)((int)((ulong)lStack_130 >> 0x20) == 0);
  auVar17._4_4_ = auVar21._0_4_;
  auVar17._0_4_ = auVar21._4_4_;
  auVar17._8_4_ = auVar21._12_4_;
  auVar17._12_4_ = auVar21._8_4_;
  auVar12._8_8_ = dStack_140 * auVar20._8_8_;
  auVar12._0_8_ = local_148 * auVar20._0_8_;
  auVar12 = ~(auVar17 & auVar21) & auVar12;
  auVar18._0_8_ = (double)local_128;
  mean_data->real_accumulated_time = (double)lVar8 * auVar12._0_8_;
  mean_data->cpu_accumulated_time = (double)lVar8 * auVar12._8_8_;
  auVar18._8_8_ = (double)lStack_120;
  auVar12 = divpd(auVar13,auVar18);
  auVar20._0_8_ = local_118 * auVar12._0_8_;
  auVar20._8_8_ = dStack_110 * auVar12._8_8_;
  auVar22._0_4_ = -(uint)((int)local_128 == 0);
  auVar22._4_4_ = -(uint)((int)((ulong)local_128 >> 0x20) == 0);
  auVar22._8_4_ = -(uint)((int)lStack_120 == 0);
  auVar22._12_4_ = -(uint)((int)((ulong)lStack_120 >> 0x20) == 0);
  auVar13._4_4_ = auVar22._0_4_;
  auVar13._0_4_ = auVar22._4_4_;
  auVar13._8_4_ = auVar22._12_4_;
  auVar13._12_4_ = auVar22._8_4_;
  auVar20 = ~(auVar13 & auVar22) & auVar20;
  mean_data->bytes_per_second = (double)auVar20._0_8_;
  mean_data->items_per_second = (double)auVar20._8_8_;
  std::__cxx11::string::_M_assign((string *)&mean_data->report_label);
  lVar8 = 0x90;
  uVar7 = 0;
  do {
    pRVar9 = (reports->
             super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar7 = uVar7 + 1;
    if ((ulong)(((long)(reports->
                       super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9) / 0x70) <= uVar7)
    goto LAB_0010d7d0;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(pRVar9->benchmark_name)._M_dataplus._M_p + lVar8);
    lVar8 = lVar8 + 0x70;
    bVar6 = std::operator!=(__lhs,&pRVar9->report_label);
  } while (!bVar6);
  std::__cxx11::string::assign((char *)&mean_data->report_label);
  pRVar9 = (reports->
           super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
           )._M_impl.super__Vector_impl_data._M_start;
LAB_0010d7d0:
  std::operator+(&local_50,&pRVar9->benchmark_name,"_stddev");
  pRVar4 = local_100;
  std::__cxx11::string::operator=((string *)local_100,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::_M_assign((string *)&pRVar4->report_label);
  pRVar4->iterations = 0;
  dVar11 = Stat1<double,_long>::StdDev(&local_98);
  pRVar4->real_accumulated_time = dVar11;
  dVar11 = Stat1<double,_long>::StdDev(&local_b8);
  pRVar4->cpu_accumulated_time = dVar11;
  dVar11 = Stat1<double,_long>::StdDev(&local_d8);
  pRVar4->bytes_per_second = dVar11;
  dVar11 = Stat1<double,_long>::StdDev(&local_f8);
  pRVar4->items_per_second = dVar11;
  return;
}

Assistant:

void BenchmarkReporter::ComputeStats(
    const std::vector<Run>& reports,
    Run* mean_data, Run* stddev_data) {
  CHECK(reports.size() >= 2) << "Cannot compute stats for less than 2 reports";
  // Accumulators.
  Stat1_d real_accumulated_time_stat;
  Stat1_d cpu_accumulated_time_stat;
  Stat1_d bytes_per_second_stat;
  Stat1_d items_per_second_stat;
  // All repetitions should be run with the same number of iterations so we
  // can take this information from the first benchmark.
  int64_t const run_iterations = reports.front().iterations;

  // Populate the accumulators.
  for (Run const& run : reports) {
    CHECK_EQ(reports[0].benchmark_name, run.benchmark_name);
    CHECK_EQ(run_iterations, run.iterations);
    real_accumulated_time_stat +=
        Stat1_d(run.real_accumulated_time/run.iterations, run.iterations);
    cpu_accumulated_time_stat +=
        Stat1_d(run.cpu_accumulated_time/run.iterations, run.iterations);
    items_per_second_stat += Stat1_d(run.items_per_second, run.iterations);
    bytes_per_second_stat += Stat1_d(run.bytes_per_second, run.iterations);
  }

  // Get the data from the accumulator to BenchmarkReporter::Run's.
  mean_data->benchmark_name = reports[0].benchmark_name + "_mean";
  mean_data->iterations = run_iterations;
  mean_data->real_accumulated_time = real_accumulated_time_stat.Mean() *
                                     run_iterations;
  mean_data->cpu_accumulated_time = cpu_accumulated_time_stat.Mean() *
                                    run_iterations;
  mean_data->bytes_per_second = bytes_per_second_stat.Mean();
  mean_data->items_per_second = items_per_second_stat.Mean();

  // Only add label to mean/stddev if it is same for all runs
  mean_data->report_label = reports[0].report_label;
  for (std::size_t i = 1; i < reports.size(); i++) {
    if (reports[i].report_label != reports[0].report_label) {
      mean_data->report_label = "";
      break;
    }
  }

  stddev_data->benchmark_name = reports[0].benchmark_name + "_stddev";
  stddev_data->report_label = mean_data->report_label;
  stddev_data->iterations = 0;
  stddev_data->real_accumulated_time =
      real_accumulated_time_stat.StdDev();
  stddev_data->cpu_accumulated_time =
      cpu_accumulated_time_stat.StdDev();
  stddev_data->bytes_per_second = bytes_per_second_stat.StdDev();
  stddev_data->items_per_second = items_per_second_stat.StdDev();
}